

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_27(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  Provider *pPVar1;
  QPDFWriter local_498 [8];
  QPDFWriter w;
  QPDFObjectHandle local_488;
  QPDFObjectHandle local_478;
  QPDFObjectHandle local_468;
  QPDFObjectHandle local_458;
  QPDFObjectHandle local_448;
  QPDFObjectHandle local_438;
  QPDFObjectHandle local_428;
  allocator<char> local_411;
  string local_410 [32];
  undefined1 local_3f0 [8];
  QPDFObjectHandle qtest2;
  QPDFObjectHandle local_3d0;
  allocator<char> local_3b9;
  string local_3b8 [32];
  undefined1 local_398 [8];
  QPDFObjectHandle trailer;
  string local_380 [32];
  undefined1 local_360 [8];
  QPDFObjectHandle s2;
  QPDFPageObjectHelper local_340;
  allocator<char> local_301;
  string local_300 [32];
  QPDFObjectHandle local_2e0;
  QPDFPageObjectHelper local_2d0;
  undefined1 local_298 [8];
  QPDFPageDocumentHelper dh;
  string local_270 [32];
  undefined1 local_250 [8];
  QPDFObjectHandle O3;
  string local_238 [32];
  QPDFObjectHandle local_218;
  undefined1 local_208 [8];
  QPDFObjectHandle qtest;
  QPDF oldpdf;
  QPDFObjectHandle local_1e0;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_1d0;
  undefined1 local_1c0 [8];
  QPDFObjectHandle s3;
  QPDF empty3;
  shared_ptr<Buffer> local_190;
  Provider *local_180;
  Provider *provider_1;
  shared_ptr<Buffer> b_1;
  Pl_Buffer pl_1;
  undefined1 local_130 [8];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p2;
  QPDFObjectHandle local_110;
  QPDF local_100 [8];
  QPDF empty2;
  QPDFObjectHandle local_e8;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_d8;
  undefined1 local_c8 [8];
  QPDFObjectHandle s1;
  QPDF empty1;
  shared_ptr<Buffer> local_98;
  Provider *local_88;
  Provider *provider;
  shared_ptr<Buffer> b;
  Pl_Buffer local_60 [8];
  Pl_Buffer pl;
  undefined1 local_28 [8];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> p1;
  char *arg2_local;
  QPDF *pdf_local;
  
  p1.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_28);
  Pl_Buffer::Pl_Buffer(local_60,"buffer",(Pipeline *)0x0);
  Pipeline::writeCStr((char *)local_60);
  Pl_Buffer::finish();
  Pl_Buffer::getBufferSharedPointer();
  pPVar1 = (Provider *)operator_new(0x28);
  std::shared_ptr<Buffer>::shared_ptr(&local_98,(shared_ptr<Buffer> *)&provider);
  Provider::Provider(pPVar1,&local_98);
  std::shared_ptr<Buffer>::~shared_ptr(&local_98);
  local_88 = pPVar1;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr<Provider,void>
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&empty1,pPVar1);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::operator=
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_28,
             (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&empty1);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&empty1);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&provider);
  Pl_Buffer::~Pl_Buffer(local_60);
  QPDF::QPDF((QPDF *)&s1.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::emptyPDF();
  QPDFObjectHandle::newStream((QPDF *)local_c8);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            (&local_d8,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_28);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData(local_c8,&local_d8,&local_e8,&empty2);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&empty2);
  QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_d8);
  QPDF::QPDF(local_100);
  QPDF::emptyPDF();
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p2.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_c8);
  QPDF::copyForeignObject((QPDFObjectHandle *)&local_110);
  QPDFObjectHandle::operator=((QPDFObjectHandle *)local_c8,&local_110);
  QPDFObjectHandle::~QPDFObjectHandle(&local_110);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &p2.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_130);
  Pl_Buffer::Pl_Buffer
            ((Pl_Buffer *)&b_1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "buffer",(Pipeline *)0x0);
  Pipeline::writeCStr((char *)&b_1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
  Pl_Buffer::finish();
  Pl_Buffer::getBufferSharedPointer();
  pPVar1 = (Provider *)operator_new(0x28);
  std::shared_ptr<Buffer>::shared_ptr(&local_190,(shared_ptr<Buffer> *)&provider_1);
  Provider::Provider(pPVar1,&local_190);
  std::shared_ptr<Buffer>::~shared_ptr(&local_190);
  local_180 = pPVar1;
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr<Provider,void>
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&empty3,pPVar1);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::operator=
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_130,
             (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&empty3);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
            ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)&empty3);
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)&provider_1);
  Pl_Buffer::~Pl_Buffer
            ((Pl_Buffer *)&b_1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::QPDF((QPDF *)&s3.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::emptyPDF();
  QPDF::setImmediateCopyFrom((bool)((char)&s3 + '\b'));
  QPDFObjectHandle::newStream((QPDF *)local_1c0);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
            (&local_1d0,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_130);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData(local_1c0,&local_1d0,&local_1e0,&oldpdf);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&oldpdf);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1e0);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_1d0);
  if (p1.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    QPDF::QPDF((QPDF *)&qtest.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDF::processFile((char *)&qtest.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,
                      (char *)p1.
                              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi);
    QPDF::getTrailer();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_238,"/QTest",
               (allocator<char> *)
               ((long)&O3.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey((string *)local_208);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&O3.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::~QPDFObjectHandle(&local_218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_270,"/O3",
               (allocator<char> *)
               ((long)&dh.m.
                       super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    QPDFObjectHandle::getKey((string *)local_250);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&dh.m.
                       super___shared_ptr<QPDFPageDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_298,pdf);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_300,"/OtherPage",&local_301);
    QPDFObjectHandle::getKey((string *)&local_2e0);
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_2d0,(QPDFObjectHandle *)&local_2e0);
    QPDFPageDocumentHelper::addPage((QPDFPageObjectHelper *)local_298,SUB81(&local_2d0,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_2d0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_2e0);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator(&local_301);
    this = &s2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this,(QPDFObjectHandle *)local_250);
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_340,(QPDFObjectHandle *)this);
    QPDFPageDocumentHelper::addPage((QPDFPageObjectHelper *)local_298,SUB81(&local_340,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_340);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &s2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_380,"potato\n",
               (allocator<char> *)
               ((long)&trailer.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::newStream
              ((QPDF *)local_360,
               (string *)
               &qtest.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_380);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&trailer.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDF::getTrailer();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3b8,"/QTest",&local_3b9);
    QPDFObjectHandle::QPDFObjectHandle
              ((QPDFObjectHandle *)
               &qtest2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (QPDFObjectHandle *)local_208);
    QPDF::copyForeignObject((QPDFObjectHandle *)&local_3d0);
    QPDFObjectHandle::replaceKey((string *)local_398,(QPDFObjectHandle *)local_3b8);
    QPDFObjectHandle::~QPDFObjectHandle(&local_3d0);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)
               &qtest2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_410,"/QTest2",&local_411);
    QPDFObjectHandle::newArray();
    QPDFObjectHandle::replaceKeyAndGetNew((string *)local_3f0,(QPDFObjectHandle *)local_398);
    QPDFObjectHandle::~QPDFObjectHandle(&local_428);
    std::__cxx11::string::~string(local_410);
    std::allocator<char>::~allocator(&local_411);
    QPDFObjectHandle::QPDFObjectHandle(&local_448,(QPDFObjectHandle *)local_c8);
    QPDF::copyForeignObject((QPDFObjectHandle *)&local_438);
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_3f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_438);
    QPDFObjectHandle::~QPDFObjectHandle(&local_448);
    QPDFObjectHandle::QPDFObjectHandle(&local_468,(QPDFObjectHandle *)local_360);
    QPDF::copyForeignObject((QPDFObjectHandle *)&local_458);
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_3f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_458);
    QPDFObjectHandle::~QPDFObjectHandle(&local_468);
    QPDFObjectHandle::QPDFObjectHandle(&local_488,(QPDFObjectHandle *)local_1c0);
    QPDF::copyForeignObject((QPDFObjectHandle *)&local_478);
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_3f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_478);
    QPDFObjectHandle::~QPDFObjectHandle(&local_488);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_3f0);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_398);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_360);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_298);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_250);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_208);
    QPDF::~QPDF((QPDF *)&qtest.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1c0);
    QPDF::~QPDF((QPDF *)&s3.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
              ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_130);
    QPDFWriter::QPDFWriter(local_498,pdf,"a.pdf");
    QPDFWriter::setStaticID(SUB81(local_498,0));
    QPDFWriter::setCompressStreams(SUB81(local_498,0));
    QPDFWriter::setDecodeLevel((qpdf_stream_decode_level_e)local_498);
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_498);
    QPDF::~QPDF(local_100);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c8);
    QPDF::~QPDF((QPDF *)&s1.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
              ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_28);
    return;
  }
  __assert_fail("arg2 != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x41b,"void test_27(QPDF &, const char *)");
}

Assistant:

static void
test_27(QPDF& pdf, char const* arg2)
{
    // Copy O3 and the page O3 refers to before copying qtest.
    // Should get qtest plus only the O3 page and the page that O3
    // points to. Inherited objects should be preserved. This test
    // also exercises copying from a stream that has a buffer and
    // a provider, including copying a provider multiple times. We
    // also exercise setImmediateCopyFrom.

    // Create a provider. The provider stays in scope.
    std::shared_ptr<QPDFObjectHandle::StreamDataProvider> p1;
    {
        // Local scope
        Pl_Buffer pl("buffer");
        pl.writeCStr("new data for stream\n");
        pl.finish();
        auto b = pl.getBufferSharedPointer();
        auto* provider = new Provider(b);
        p1 = decltype(p1)(provider);
    }
    // Create a stream that uses a provider in empty1 and copy it
    // to empty2. It is copied from empty2 to the final pdf.
    QPDF empty1;
    empty1.emptyPDF();
    QPDFObjectHandle s1 = QPDFObjectHandle::newStream(&empty1);
    s1.replaceStreamData(p1, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    QPDF empty2;
    empty2.emptyPDF();
    s1 = empty2.copyForeignObject(s1);
    {
        // Make sure some source PDFs are out of scope when we
        // write.

        std::shared_ptr<QPDFObjectHandle::StreamDataProvider> p2;
        // Create another provider. This one will go out of scope
        // along with its containing qpdf, which has
        // setImmediateCopyFrom(true).
        {
            // Local scope
            Pl_Buffer pl("buffer");
            pl.writeCStr("more data for stream\n");
            pl.finish();
            auto b = pl.getBufferSharedPointer();
            auto* provider = new Provider(b);
            p2 = decltype(p2)(provider);
        }
        QPDF empty3;
        empty3.emptyPDF();
        empty3.setImmediateCopyFrom(true);
        QPDFObjectHandle s3 = QPDFObjectHandle::newStream(&empty3);
        s3.replaceStreamData(p2, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
        assert(arg2 != nullptr);
        QPDF oldpdf;
        oldpdf.processFile(arg2);
        QPDFObjectHandle qtest = oldpdf.getTrailer().getKey("/QTest");
        QPDFObjectHandle O3 = qtest.getKey("/O3");
        QPDFPageDocumentHelper dh(pdf);
        dh.addPage(O3.getKey("/OtherPage"), false);
        dh.addPage(O3, false);
        QPDFObjectHandle s2 = QPDFObjectHandle::newStream(&oldpdf, "potato\n");
        auto trailer = pdf.getTrailer();
        trailer.replaceKey("/QTest", pdf.copyForeignObject(qtest));
        auto qtest2 = trailer.replaceKeyAndGetNew("/QTest2", QPDFObjectHandle::newArray());
        qtest2.appendItem(pdf.copyForeignObject(s1));
        qtest2.appendItem(pdf.copyForeignObject(s2));
        qtest2.appendItem(pdf.copyForeignObject(s3));
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setCompressStreams(false);
    w.setDecodeLevel(qpdf_dl_generalized);
    w.write();
}